

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O2

void anon_unknown.dwarf_259baf::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  half *phVar1;
  float fVar2;
  LineOrder LVar3;
  Compression CVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  bool ytc;
  bool bVar7;
  bool bVar8;
  _Rb_tree_color _Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  Compression CVar16;
  long lVar17;
  long lVar18;
  ostream *poVar19;
  Compression *pCVar20;
  LineOrder *pLVar21;
  ChannelList *pCVar22;
  Header *pHVar23;
  Box2i *pBVar24;
  Box2i *pBVar25;
  float *pfVar26;
  V2f *pVVar27;
  V2f *pVVar28;
  ChannelList *pCVar29;
  uint uVar30;
  half *phVar31;
  long lVar32;
  int ly;
  half *phVar33;
  long lVar34;
  long in_R10;
  long lVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  TiledInputFile in2;
  long local_228;
  FrameBuffer fb;
  long local_1d8;
  Array2D<half> ph2;
  TiledInputFile in1;
  Array2D<half> ph1;
  FrameBuffer fb2;
  Array2D<half> ph1_1;
  Header hdr;
  TiledOutputFile out;
  string filename2;
  string filename1;
  
  std::operator+(&filename1,tempDir,"imf_test_copy1.exr");
  std::operator+(&filename2,tempDir,"imf_test_copy2.exr");
  _Var9 = w + 0xaa;
  iVar10 = h + 0x102;
  lVar17 = (long)-h;
  lVar18 = (long)-w;
  CVar16 = NO_COMPRESSION;
  do {
    if (CVar16 == NUM_COMPRESSION_METHODS) {
      std::__cxx11::string::~string((string *)&filename2);
      std::__cxx11::string::~string((string *)&filename1);
      return;
    }
    for (uVar30 = 0; _Var6._M_p = filename1._M_dataplus._M_p,
        _Var5._M_p = filename2._M_dataplus._M_p, uVar30 != 2; uVar30 = uVar30 + 1) {
      poVar19 = std::operator<<((ostream *)&std::cout,"levelMode 0, ");
      poVar19 = std::operator<<(poVar19,"compression ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,CVar16);
      poVar19 = std::operator<<(poVar19,", roundingMode ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
      poVar19 = std::operator<<(poVar19,", xOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      poVar19 = std::operator<<(poVar19,", yOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,h);
      std::endl<char,std::char_traits<char>>(poVar19);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var9;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar10;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      *pCVar20 = CVar16;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar21 = INCREASING_Y;
      pCVar22 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar22,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)((ulong)uVar30 << 0x20);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      ph1._data = (half *)operator_new__(0x15a02);
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph1._data + ph1._sizeY * lVar17 + lVar18),2,0x156,1,1,
                 0.0,SUB81(in_R10,0),SUB81(ph1._data + ph1._sizeY * lVar17,0));
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var6._M_p,&hdr,iVar11);
      Imf_2_5::TiledOutputFile::setFrameBuffer(&out,&fb);
      iVar11 = Imf_2_5::TiledOutputFile::numXTiles(&out,0);
      iVar12 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      Imf_2_5::TiledOutputFile::writeTiles(&out,0,iVar11 + -1,0,iVar12 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var5._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var6._M_p,iVar11);
      pHVar23 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var5._M_p,pHVar23,iVar11);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in1,_Var6._M_p,iVar11);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in2,_Var5._M_p,iVar11);
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      lVar37 = (long)(pBVar24->min).x;
      lVar32 = (pBVar24->max).x - lVar37;
      lVar34 = lVar32 + 1;
      lVar41 = (long)(pBVar24->min).y;
      lVar35 = (pBVar24->max).y - lVar41;
      lVar39 = lVar35 + 1;
      Imf_2_5::Array2D<half>::Array2D(&ph1_1,lVar39,lVar34);
      Imf_2_5::Array2D<half>::Array2D(&ph2,lVar39,lVar34);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar41 = -lVar41;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph1_1._data + (ph1_1._sizeY * lVar41 - lVar37)),2,
                 lVar34 * 2,1,1,0.0,SUB81(in_R10,0),
                 SUB81(fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph2._data + (lVar41 * ph2._sizeY - lVar37)),2,
                 lVar34 * 2,1,1,0.0,SUB81(in_R10,0),ytc);
      Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
      Imf_2_5::TiledInputFile::setFrameBuffer(&in1,&fb);
      iVar11 = Imf_2_5::TiledInputFile::numXTiles(&in1,0);
      iVar12 = Imf_2_5::TiledInputFile::numYTiles(&in1,0);
      Imf_2_5::TiledInputFile::readTiles(&in1,0,iVar11 + -1,0,iVar12 + -1,0);
      Imf_2_5::TiledInputFile::setFrameBuffer(&in2,&fb2);
      iVar11 = Imf_2_5::TiledInputFile::numXTiles(&in2,0);
      iVar12 = Imf_2_5::TiledInputFile::numYTiles(&in2,0);
      Imf_2_5::TiledInputFile::readTiles(&in2,0,iVar11 + -1,0,iVar12 + -1,0);
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::displayWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::displayWindow(&hdr);
      bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar7) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa0,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::dataWindow(&hdr);
      bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar7) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa1,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa2,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pVVar27 = Imf_2_5::Header::screenWindowCenter(pHVar23);
      pVVar28 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar27->x != pVVar28->x) || (NAN(pVVar27->x) || NAN(pVVar28->x))) ||
          (pVVar27->y != pVVar28->y)) || (NAN(pVVar27->y) || NAN(pVVar28->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa3,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar26 = Imf_2_5::Header::screenWindowWidth(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa4,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pLVar21 = Imf_2_5::Header::lineOrder(pHVar23);
      LVar3 = *pLVar21;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar3 != *pLVar21) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa5,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar20 = Imf_2_5::Header::compression(pHVar23);
      CVar4 = *pCVar20;
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      if (CVar4 != *pCVar20) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa6,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar22 = Imf_2_5::Header::channels(pHVar23);
      pCVar29 = Imf_2_5::Header::channels(&hdr);
      bVar7 = Imf_2_5::ChannelList::operator==(pCVar22,pCVar29);
      if (!bVar7) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa7,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      local_1d8._0_4_ = (int)lVar32;
      phVar31 = ph1_1._data;
      phVar33 = ph2._data;
      for (lVar34 = 0; lVar34 <= (int)lVar35; lVar34 = lVar34 + 1) {
        in_R10 = 0;
        while (in_R10 <= (int)local_1d8) {
          fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar31[in_R10]._h * 4);
          phVar1 = phVar33 + in_R10;
          in_R10 = in_R10 + 1;
          pfVar26 = (float *)((long)&half::_toFloat + (ulong)phVar1->_h * 4);
          if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                          ,0xab,
                          "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                         );
          }
        }
        phVar33 = phVar33 + ph2._sizeY;
        phVar31 = phVar31 + ph1_1._sizeY;
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Array2D<half>::~Array2D(&ph2);
      Imf_2_5::Array2D<half>::~Array2D(&ph1_1);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in2);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var6._M_p);
      remove(_Var5._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_2_5::Array2D<half>::~Array2D(&ph1);
      Imf_2_5::Header::~Header(&hdr);
      _Var6 = filename1._M_dataplus;
      _Var5 = filename2._M_dataplus;
      poVar19 = std::operator<<((ostream *)&std::cout,"levelMode 1, ");
      poVar19 = std::operator<<(poVar19,"compression ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,CVar16);
      poVar19 = std::operator<<(poVar19,", roundingMode ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
      poVar19 = std::operator<<(poVar19,", xOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      poVar19 = std::operator<<(poVar19,", yOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,h);
      std::endl<char,std::char_traits<char>>(poVar19);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var9;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar10;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      *pCVar20 = CVar16;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar21 = INCREASING_Y;
      pCVar22 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar22,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)CONCAT44(uVar30,1);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var6._M_p,&hdr,iVar11);
      iVar11 = Imf_2_5::TiledOutputFile::numLevels((TiledOutputFile *)&fb2);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::resizeErase
                ((Array<Imf_2_5::Array2D<half>_> *)&ph1,(long)iVar11);
      lVar34 = 0;
      lVar39 = 0;
      while( true ) {
        iVar11 = Imf_2_5::TiledOutputFile::numLevels((TiledOutputFile *)&fb2);
        bVar7 = SUB41(-w,0);
        if (iVar11 <= lVar39) break;
        iVar14 = (int)lVar39;
        iVar11 = Imf_2_5::TiledOutputFile::levelWidth((TiledOutputFile *)&fb2,iVar14);
        iVar12 = Imf_2_5::TiledOutputFile::levelHeight((TiledOutputFile *)&fb2,iVar14);
        Imf_2_5::Array2D<half>::resizeErase
                  ((Array2D<half> *)(ph1._sizeY + lVar34),(long)iVar12,(long)iVar11);
        fillPixels((Array2D<half> *)(ph1._sizeY + lVar34),iVar11,iVar12);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_2_5::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar34) * lVar17 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar34) + lVar18 * 2),2,(long)iVar11 * 2,1
                   ,1,0.0,SUB81(in_R10,0),bVar7);
        Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
        Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fb2,&fb);
        iVar11 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fb2,iVar14);
        iVar12 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fb2,iVar14);
        Imf_2_5::TiledOutputFile::writeTiles
                  ((TiledOutputFile *)&fb2,0,iVar11 + -1,0,iVar12 + -1,iVar14);
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&fb);
        lVar39 = lVar39 + 1;
        lVar34 = lVar34 + 0x18;
      }
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var5._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var6._M_p,iVar11);
      pHVar23 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var5._M_p,pHVar23,iVar11);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1_1,_Var6._M_p,iVar11);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&ph2,_Var5._M_p,iVar11);
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      iVar11 = (pBVar24->min).x;
      iVar12 = (pBVar24->min).y;
      uVar13 = Imf_2_5::TiledInputFile::numLevels((TiledInputFile *)&ph2);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array
                ((Array<Imf_2_5::Array2D<half>_> *)&in1,(long)(int)uVar13);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array
                ((Array<Imf_2_5::Array2D<half>_> *)&in2,(long)(int)uVar13);
      lVar34 = -(long)iVar12;
      uVar38 = 0;
      if ((int)uVar13 < 1) {
        uVar13 = uVar38;
      }
      for (lVar39 = 0; (ulong)uVar13 * 0x18 != lVar39; lVar39 = lVar39 + 0x18) {
        iVar12 = Imf_2_5::TiledInputFile::levelWidth((TiledInputFile *)&ph2,uVar38);
        iVar14 = Imf_2_5::TiledInputFile::levelHeight((TiledInputFile *)&ph2,uVar38);
        lVar32 = (long)iVar12;
        Imf_2_5::Array2D<half>::resizeErase
                  ((Array2D<half> *)
                   ((long)&((in1._data)->super_Mutex).super___mutex_base._M_mutex + lVar39),
                   (long)iVar14,lVar32);
        Imf_2_5::Array2D<half>::resizeErase
                  ((Array2D<half> *)
                   ((long)&((in2._data)->super_Mutex).super___mutex_base._M_mutex + lVar39),
                   (long)iVar14,lVar32);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_2_5::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)((long)&((in1._data)->super_Mutex).super___mutex_base._M_mutex
                                     + lVar39 + 8) * lVar34 * 2 +
                            *(long *)((long)&((in1._data)->super_Mutex).super___mutex_base._M_mutex
                                     + lVar39 + 0x10) + (long)iVar11 * -2),2,lVar32 * 2,1,1,0.0,
                   SUB81(in_R10,0),(bool)-(char)iVar11);
        Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
        Imf_2_5::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)((long)&((in2._data)->super_Mutex).super___mutex_base._M_mutex
                                     + lVar39 + 8) * lVar34 * 2 +
                            *(long *)((long)&((in2._data)->super_Mutex).super___mutex_base._M_mutex
                                     + lVar39 + 0x10) + (long)iVar11 * -2),2,lVar32 * 2,1,1,0.0,
                   SUB81(in_R10,0),(bool)-(char)iVar11);
        Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
        Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&ph1_1,&fb);
        Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&ph2,&fb2);
        iVar12 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&ph1_1,uVar38);
        iVar14 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&ph1_1,uVar38);
        Imf_2_5::TiledInputFile::readTiles
                  ((TiledInputFile *)&ph1_1,0,iVar12 + -1,0,iVar14 + -1,uVar38);
        iVar12 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&ph2,uVar38);
        iVar14 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&ph2,uVar38);
        Imf_2_5::TiledInputFile::readTiles
                  ((TiledInputFile *)&ph2,0,iVar12 + -1,0,iVar14 + -1,uVar38);
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&fb2);
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&fb);
        uVar38 = uVar38 + 1;
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pBVar24 = Imf_2_5::Header::displayWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::displayWindow(&hdr);
      bVar8 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar8) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x129,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::dataWindow(&hdr);
      bVar8 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar8) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12a,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,299,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pVVar27 = Imf_2_5::Header::screenWindowCenter(pHVar23);
      pVVar28 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar27->x != pVVar28->x) || (NAN(pVVar27->x) || NAN(pVVar28->x))) ||
          (pVVar27->y != pVVar28->y)) || (NAN(pVVar27->y) || NAN(pVVar28->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pfVar26 = Imf_2_5::Header::screenWindowWidth(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pLVar21 = Imf_2_5::Header::lineOrder(pHVar23);
      LVar3 = *pLVar21;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar3 != *pLVar21) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pCVar20 = Imf_2_5::Header::compression(pHVar23);
      CVar4 = *pCVar20;
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      if (CVar4 != *pCVar20) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12f,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header((TiledInputFile *)&ph2);
      pCVar22 = Imf_2_5::Header::channels(pHVar23);
      pCVar29 = Imf_2_5::Header::channels(&hdr);
      bVar8 = Imf_2_5::ChannelList::operator==(pCVar22,pCVar29);
      if (!bVar8) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      for (uVar40 = 0; uVar40 != uVar13; uVar40 = uVar40 + 1) {
        lVar34 = 0;
        lVar39 = 0;
        while( true ) {
          iVar11 = Imf_2_5::TiledInputFile::levelHeight((TiledInputFile *)&ph1_1,(int)uVar40);
          if (iVar11 <= lVar39) break;
          for (lVar32 = 0;
              iVar11 = Imf_2_5::TiledInputFile::levelWidth((TiledInputFile *)&ph1_1,(int)uVar40),
              lVar32 < iVar11; lVar32 = lVar32 + 1) {
            lVar35 = uVar40 * 0x18;
            fVar2 = *(float *)((long)&half::_toFloat +
                              (ulong)*(ushort *)
                                      (*(long *)((long)&((in2._data)->super_Mutex).
                                                        super___mutex_base._M_mutex + lVar35 + 8) *
                                       lVar34 + *(long *)((long)&((in2._data)->super_Mutex).
                                                                 super___mutex_base._M_mutex +
                                                         lVar35 + 0x10) + lVar32 * 2) * 4);
            pfVar26 = (float *)((long)&half::_toFloat +
                               (ulong)*(ushort *)
                                       (*(long *)((long)&((in1._data)->super_Mutex).
                                                         super___mutex_base._M_mutex + lVar35 + 8) *
                                        lVar34 + *(long *)((long)&((in1._data)->super_Mutex).
                                                                  super___mutex_base._M_mutex +
                                                          lVar35 + 0x10) + lVar32 * 2) * 4);
            if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
              __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                            ,0x136,
                            "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                           );
            }
            if ((CVar16 - DWAA_COMPRESSION < 0xfffffffe) &&
               ((pfVar26 = (float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)
                                            (*(long *)(ph1._sizeY + 8 + lVar35) * lVar34 +
                                             *(long *)(ph1._sizeY + 0x10 + lVar35) + lVar32 * 2) * 4
                                    ), fVar2 != *pfVar26 || (NAN(fVar2) || NAN(*pfVar26))))) {
              __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                            ,0x139,
                            "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                           );
            }
          }
          lVar39 = lVar39 + 1;
          lVar34 = lVar34 + 2;
        }
      }
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array((Array<Imf_2_5::Array2D<half>_> *)&in2);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array((Array<Imf_2_5::Array2D<half>_> *)&in1);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph2);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1_1);
      remove(_Var6._M_p);
      remove(_Var5._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array((Array<Imf_2_5::Array2D<half>_> *)&ph1);
      Imf_2_5::Header::~Header(&hdr);
      _Var6 = filename1._M_dataplus;
      _Var5 = filename2._M_dataplus;
      poVar19 = std::operator<<((ostream *)&std::cout,"levelMode 2, ");
      poVar19 = std::operator<<(poVar19,"compression ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,CVar16);
      poVar19 = std::operator<<(poVar19,", roundingMode ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
      poVar19 = std::operator<<(poVar19,", xOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      poVar19 = std::operator<<(poVar19,", yOffset ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,h);
      std::endl<char,std::char_traits<char>>(poVar19);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var9;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar10;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      *pCVar20 = CVar16;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar21 = INCREASING_Y;
      pCVar22 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar22,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)CONCAT44(uVar30,2);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      ph1._data = (half *)0x0;
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var6._M_p,&hdr,iVar11);
      iVar11 = Imf_2_5::TiledOutputFile::numYLevels((TiledOutputFile *)&fb2);
      iVar12 = Imf_2_5::TiledOutputFile::numXLevels((TiledOutputFile *)&fb2);
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::resizeErase
                ((Array2D<Imf_2_5::Array2D<half>_> *)&ph1,(long)iVar11,(long)iVar12);
      local_1d8 = 0;
      for (lVar34 = 0; iVar11 = Imf_2_5::TiledOutputFile::numYLevels((TiledOutputFile *)&fb2),
          lVar34 < iVar11; lVar34 = lVar34 + 1) {
        local_228 = 0;
        for (lVar39 = 0; iVar11 = Imf_2_5::TiledOutputFile::numXLevels((TiledOutputFile *)&fb2),
            lVar39 < iVar11; lVar39 = lVar39 + 1) {
          iVar14 = (int)lVar39;
          iVar11 = Imf_2_5::TiledOutputFile::levelWidth((TiledOutputFile *)&fb2,iVar14);
          iVar15 = (int)lVar34;
          iVar12 = Imf_2_5::TiledOutputFile::levelHeight((TiledOutputFile *)&fb2,iVar15);
          Imf_2_5::Array2D<half>::resizeErase
                    ((Array2D<half> *)((long)&(ph1._data)->_h + local_228 + ph1._sizeY * local_1d8),
                     (long)iVar12,(long)iVar11);
          fillPixels((Array2D<half> *)((long)&(ph1._data)->_h + local_228 + ph1._sizeY * local_1d8),
                     iVar11,iVar12);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph1._data[4]._h + ph1._sizeY * local_1d8 + local_228)
                              * lVar17 * 2 +
                              *(long *)((long)&ph1._data[8]._h + ph1._sizeY * local_1d8 + local_228)
                             + lVar18 * 2),2,(long)iVar11 * 2,1,1,0.0,SUB81(in_R10,0),bVar7);
          Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
          Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fb2,&fb);
          iVar11 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fb2,iVar14);
          iVar12 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fb2,iVar15);
          Imf_2_5::TiledOutputFile::writeTiles
                    ((TiledOutputFile *)&fb2,0,iVar11 + -1,0,iVar12 + -1,iVar14,iVar15);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb);
          local_228 = local_228 + 0x18;
        }
        local_1d8 = local_1d8 + 0x18;
      }
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var5._M_p);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var6._M_p,iVar11);
      pHVar23 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var5._M_p,pHVar23,iVar11);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in1,_Var6._M_p,iVar11);
      iVar11 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in2,_Var5._M_p,iVar11);
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      iVar11 = (pBVar24->min).x;
      iVar12 = (pBVar24->min).y;
      uVar13 = Imf_2_5::TiledInputFile::numXLevels(&in2);
      uVar38 = Imf_2_5::TiledInputFile::numYLevels(&in2);
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::Array2D
                ((Array2D<Imf_2_5::Array2D<half>_> *)&ph1_1,(long)(int)uVar38,(long)(int)uVar13);
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::Array2D
                ((Array2D<Imf_2_5::Array2D<half>_> *)&ph2,(long)(int)uVar38,(long)(int)uVar13);
      lVar34 = -(long)iVar12;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      if ((int)uVar38 < 1) {
        uVar38 = 0;
      }
      local_1d8 = 0;
      for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
        iVar12 = 0;
        for (lVar39 = 0; (ulong)uVar13 * 0x18 != lVar39; lVar39 = lVar39 + 0x18) {
          iVar14 = Imf_2_5::TiledInputFile::levelWidth(&in2,iVar12);
          ly = (int)uVar40;
          iVar15 = Imf_2_5::TiledInputFile::levelHeight(&in2,ly);
          lVar32 = (long)iVar14;
          Imf_2_5::Array2D<half>::resizeErase
                    ((Array2D<half> *)((long)&(ph1_1._data)->_h + lVar39 + ph1_1._sizeY * local_1d8)
                     ,(long)iVar15,lVar32);
          Imf_2_5::Array2D<half>::resizeErase
                    ((Array2D<half> *)((long)&(ph2._data)->_h + lVar39 + ph2._sizeY * local_1d8),
                     (long)iVar15,lVar32);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph1_1._data[4]._h + ph1_1._sizeY * local_1d8 + lVar39
                                       ) * lVar34 * 2 +
                              *(long *)((long)&ph1_1._data[8]._h + ph1_1._sizeY * local_1d8 + lVar39
                                       ) + (long)iVar11 * -2),2,lVar32 * 2,1,1,0.0,SUB81(in_R10,0),
                     (bool)-(char)iVar11);
          Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph2._data[4]._h + ph2._sizeY * local_1d8 + lVar39) *
                              lVar34 * 2 +
                              *(long *)((long)&ph2._data[8]._h + ph2._sizeY * local_1d8 + lVar39) +
                             (long)iVar11 * -2),2,lVar32 * 2,1,1,0.0,SUB81(in_R10,0),
                     (bool)-(char)iVar11);
          Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
          Imf_2_5::TiledInputFile::setFrameBuffer(&in1,&fb);
          Imf_2_5::TiledInputFile::setFrameBuffer(&in2,&fb2);
          iVar14 = Imf_2_5::TiledInputFile::numXTiles(&in1,iVar12);
          iVar15 = Imf_2_5::TiledInputFile::numYTiles(&in1,ly);
          Imf_2_5::TiledInputFile::readTiles(&in1,0,iVar14 + -1,0,iVar15 + -1,iVar12,ly);
          iVar14 = Imf_2_5::TiledInputFile::numXTiles(&in2,iVar12);
          iVar15 = Imf_2_5::TiledInputFile::numYTiles(&in2,ly);
          Imf_2_5::TiledInputFile::readTiles(&in2,0,iVar14 + -1,0,iVar15 + -1,iVar12,ly);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb);
          iVar12 = iVar12 + 1;
        }
        local_1d8 = local_1d8 + 0x18;
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::displayWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::displayWindow(&hdr);
      bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar7) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1bf,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar24 = Imf_2_5::Header::dataWindow(pHVar23);
      pBVar25 = Imf_2_5::Header::dataWindow(&hdr);
      bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar7) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pVVar27 = Imf_2_5::Header::screenWindowCenter(pHVar23);
      pVVar28 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar27->x != pVVar28->x) || (NAN(pVVar27->x) || NAN(pVVar28->x))) ||
          (pVVar27->y != pVVar28->y)) || (NAN(pVVar27->y) || NAN(pVVar28->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar26 = Imf_2_5::Header::screenWindowWidth(pHVar23);
      fVar2 = *pfVar26;
      pfVar26 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c3,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pLVar21 = Imf_2_5::Header::lineOrder(pHVar23);
      LVar3 = *pLVar21;
      pLVar21 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar3 != *pLVar21) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c4,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar20 = Imf_2_5::Header::compression(pHVar23);
      CVar4 = *pCVar20;
      pCVar20 = Imf_2_5::Header::compression(&hdr);
      if (CVar4 != *pCVar20) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c5,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar23 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar22 = Imf_2_5::Header::channels(pHVar23);
      pCVar29 = Imf_2_5::Header::channels(&hdr);
      bVar7 = Imf_2_5::ChannelList::operator==(pCVar22,pCVar29);
      if (!bVar7) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c6,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
        for (uVar36 = 0; uVar36 != uVar13; uVar36 = uVar36 + 1) {
          lVar34 = 0;
          for (lVar39 = 0; iVar11 = Imf_2_5::TiledInputFile::levelHeight(&in1,(int)uVar40),
              lVar39 < iVar11; lVar39 = lVar39 + 1) {
            for (lVar32 = 0; iVar11 = Imf_2_5::TiledInputFile::levelWidth(&in1,(int)uVar36),
                lVar32 < iVar11; lVar32 = lVar32 + 1) {
              fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)
                                        (*(long *)(ph2._data +
                                                  ph2._sizeY * uVar40 * 0xc + uVar36 * 0xc + 4) *
                                         lVar34 + *(long *)(ph2._data +
                                                           ph2._sizeY * uVar40 * 0xc +
                                                           uVar36 * 0xc + 8) + lVar32 * 2) * 4);
              pfVar26 = (float *)((long)&half::_toFloat +
                                 (ulong)*(ushort *)
                                         (*(long *)(ph1_1._data +
                                                   ph1_1._sizeY * uVar40 * 0xc + uVar36 * 0xc + 4) *
                                          lVar34 + *(long *)(ph1_1._data +
                                                            ph1_1._sizeY * uVar40 * 0xc +
                                                            uVar36 * 0xc + 8) + lVar32 * 2) * 4);
              if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
                __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                              ,0x1ce,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((CVar16 - DWAA_COMPRESSION < 0xfffffffe) &&
                 ((pfVar26 = (float *)((long)&half::_toFloat +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._data +
                                                        ph1._sizeY * uVar40 * 0xc + uVar36 * 0xc + 4
                                                        ) * lVar34 +
                                               *(long *)(ph1._data +
                                                        ph1._sizeY * uVar40 * 0xc + uVar36 * 0xc + 8
                                                        ) + lVar32 * 2) * 4), fVar2 != *pfVar26 ||
                  (NAN(fVar2) || NAN(*pfVar26))))) {
                __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                              ,0x1d2,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
            }
            lVar34 = lVar34 + 2;
          }
        }
      }
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::~Array2D((Array2D<Imf_2_5::Array2D<half>_> *)&ph2);
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<half>_> *)&ph1_1);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in2);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var6._M_p);
      remove(_Var5._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::~Array2D((Array2D<Imf_2_5::Array2D<half>_> *)&ph1);
      Imf_2_5::Header::~Header(&hdr);
    }
    CVar16 = CVar16 + RLE_COMPRESSION;
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string &tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
	for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
	{
	    writeCopyReadONE (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));

	    writeCopyReadMIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
			      
	    writeCopyReadRIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
	}
    }
}